

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv4transmitter.cpp
# Opt level: O2

void __thiscall jrtplib::RTPUDPv4Transmitter::GetLocalIPList_DNS(RTPUDPv4Transmitter *this)

{
  hostent *phVar1;
  byte bVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  uint32_t ip;
  char name [1024];
  
  gethostname(name,0x3ff);
  name[0x3ff] = '\0';
  phVar1 = gethostbyname(name);
  if (phVar1 == (hostent *)0x0) {
    return;
  }
  bVar5 = false;
  uVar4 = 0;
  do {
    do {
      if (bVar5) {
        return;
      }
      bVar5 = phVar1->h_addr_list[uVar4] == (char *)0x0;
    } while (bVar5);
    ip = 0;
    bVar2 = 0x18;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      ip = ip | (uint)(byte)phVar1->h_addr_list[uVar4][lVar3] << (bVar2 & 0x1f);
      bVar2 = bVar2 - 8;
    }
    std::__cxx11::list<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->localIPs,&ip);
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

void RTPUDPv4Transmitter::GetLocalIPList_DNS()
{
	struct hostent *he;
	char name[1024];
	bool done;
	int i,j;

	gethostname(name,1023);
	name[1023] = 0;
	he = gethostbyname(name);
	if (he == 0)
		return;
	
	i = 0;
	done = false;
	while (!done)
	{
		if (he->h_addr_list[i] == NULL)
			done = true;
		else
		{
			uint32_t ip = 0;

			for (j = 0 ; j < 4 ; j++)
				ip |= ((uint32_t)((unsigned char)he->h_addr_list[i][j])<<((3-j)*8));
			localIPs.push_back(ip);
			i++;
		}
	}
}